

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::GeometryShaderTests::init(GeometryShaderTests *this,EVP_PKEY_CTX *ctx)

{
  string *__return_storage_ptr__;
  Context *pCVar1;
  bool bVar2;
  GeometryShaderInputType GVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestCaseGroup *pTVar5;
  GeometryProgramLimitCase *pGVar6;
  TestNode *pTVar7;
  ImplementationLimitCase *pIVar8;
  PrimitivesGeneratedQueryCase *pPVar9;
  OutputCountCase *pOVar10;
  VaryingOutputCountCase *pVVar11;
  BuiltinVariableRenderTest *pBVar12;
  GeometryExpanderRenderTest *pGVar13;
  long lVar14;
  TriangleStripAdjacencyVertexCountTest *this_00;
  char *pcVar15;
  char *pcVar16;
  EmitTest *this_01;
  VaryingTest *this_02;
  LayeredRenderCase *pLVar17;
  GeometryInvocationCase *pGVar18;
  DrawInstancedGeometryInstancedCase *this_03;
  NegativeDrawCase *this_04;
  VertexFeedbackCase *pVVar19;
  VertexFeedbackOverflowCase *pVVar20;
  GeometryShaderInputType inputType_00;
  GLenum primitive;
  GeometryShaderInputType inputType_01;
  GLenum primitive_00;
  int local_d48;
  int legalNdx;
  bool isLegal;
  string local_d20;
  allocator<char> local_cf9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  undefined1 local_c98 [8];
  string desc_6;
  string local_c58;
  allocator<char> local_c31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  undefined1 local_bd0 [8];
  string name_6;
  GLenum primitiveType;
  GLenum inputType;
  int primitiveTypeNdx;
  int inputTypeNdx;
  string local_b80;
  allocator<char> local_b59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  undefined1 local_ad8 [8];
  string desc_5;
  string local_a98;
  allocator<char> local_a71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  undefined1 local_9f0 [8];
  string name_5;
  int local_9c8;
  int invocationNdx;
  int instanceNdx;
  undefined1 local_9a0 [8];
  string desc_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  undefined1 local_958 [8];
  string name_4;
  int targetNdx_2;
  undefined1 local_910 [8];
  string desc_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined1 local_8c8 [8];
  string name_3;
  int targetNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  int local_840;
  undefined1 local_83a;
  allocator<char> local_839;
  int ndx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  allocator<char> local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  int local_770;
  allocator<char> local_769;
  int ndx_4;
  undefined1 local_748 [8];
  string desc_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  undefined1 local_700 [8];
  string name_2;
  int local_6d8;
  int targetNdx;
  int testNdx;
  int ndx_3;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  string local_610;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_570;
  string local_550;
  allocator<char> local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  string desc_1;
  string local_448;
  allocator<char> local_421;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  undefined1 local_3a0 [8];
  string name_1;
  int ndx_2;
  int ndx_1;
  undefined1 local_358 [8];
  string desc;
  undefined1 local_318 [8];
  string name;
  int vtxCount;
  int ndx;
  TestCaseGroup *triStripAdjacencyGroup;
  TestCaseGroup *basicPrimitiveGroup;
  OutputCountPatternSpec local_2d8;
  undefined1 local_2b9;
  OutputCountPatternSpec local_2b8;
  undefined1 local_299;
  OutputCountPatternSpec local_298;
  undefined1 local_279;
  OutputCountPatternSpec local_278;
  undefined1 local_259;
  OutputCountPatternSpec local_258;
  undefined1 local_239;
  OutputCountPatternSpec local_238;
  undefined1 local_219;
  OutputCountPatternSpec local_218;
  undefined1 local_1f9;
  OutputCountPatternSpec local_1f8;
  undefined1 local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_18a;
  allocator<char> local_189;
  string local_188;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  undefined1 local_ea;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  TestNode *local_78;
  TestCaseGroup *feedbackGroup;
  TestCaseGroup *negativeGroup;
  TestCaseGroup *instancedGroup;
  TestCaseGroup *layeredGroup;
  TestCaseGroup *varyingGroup;
  TestCaseGroup *emitGroup;
  TestCaseGroup *conversionPrimitiveGroup;
  TestCaseGroup *inputPrimitiveGroup;
  TestCaseGroup *basicGroup;
  TestNode *local_20;
  TestCaseGroup *queryGroup;
  GeometryShaderTests *this_local;
  
  queryGroup = (TestCaseGroup *)this;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"query",
             "Query tests.");
  local_20 = pTVar4;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic"
             ,"Basic tests.");
  inputPrimitiveGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"input"
             ,"Different input primitives.");
  conversionPrimitiveGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "conversion","Different input and output primitives.");
  emitGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"emit",
             "Different emit counts.");
  varyingGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "varying","Test varyings.");
  layeredGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "layered","Layered rendering.");
  instancedGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instanced","Instanced rendering.");
  negativeGroup = pTVar5;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative","Negative tests.");
  feedbackGroup = pTVar5;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "vertex_transform_feedback","Transform feedback.");
  local_78 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,local_20);
  tcu::TestNode::addChild((TestNode *)this,&inputPrimitiveGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&conversionPrimitiveGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&emitGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&varyingGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&layeredGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&instancedGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&negativeGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&feedbackGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,local_78);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_9a = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"MaxGeometryInputComponents",&local_99);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_input_components","",0x9123,&local_98,0x40);
  local_9a = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_c2 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"MaxGeometryOutputComponents",&local_c1);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_output_components","",0x9124,&local_c0,0x40);
  local_c2 = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_ea = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"MaxGeometryImageUniforms",&local_e9);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_image_uniforms","",0x90cd,&local_e8,0);
  local_ea = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_112 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"MaxGeometryTextureImageUnits",&local_111);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_texture_image_units","",0x8c29,&local_110,0x10);
  local_112 = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_13a = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"MaxGeometryOutputVertices",&local_139);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_output_vertices","",0x8de0,&local_138,0x100);
  local_13a = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_162 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"MaxGeometryTotalOutputComponents",&local_161);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_total_output_components","",0x8de1,&local_160,0x400);
  local_162 = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_18a = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"MaxGeometryUniformComponents",&local_189);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_uniform_components","",0x8ddf,&local_188,0x400);
  local_18a = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_1b2 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"MaxGeometryAtomicCounters",&local_1b1);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_atomic_counters","",0x92d5,&local_1b0,0);
  local_1b2 = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  pTVar4 = local_20;
  pGVar6 = (GeometryProgramLimitCase *)operator_new(0xa8);
  local_1da = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"MaxGeometryAtomicCounterBuffers",&local_1d9);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar6,pCVar1,"max_geometry_atomic_counter_buffers","",0x92cf,&local_1d8,0);
  local_1da = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar6);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x98);
  anon_unknown_1::GeometryShaderVerticesQueryCase::GeometryShaderVerticesQueryCase
            ((GeometryShaderVerticesQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "geometry_linked_vertices_out","GL_GEOMETRY_LINKED_VERTICES_OUT");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x98);
  anon_unknown_1::GeometryShaderInputQueryCase::GeometryShaderInputQueryCase
            ((GeometryShaderInputQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "geometry_linked_input_type","GL_GEOMETRY_LINKED_INPUT_TYPE");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x98);
  anon_unknown_1::GeometryShaderOutputQueryCase::GeometryShaderOutputQueryCase
            ((GeometryShaderOutputQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "geometry_linked_output_type","GL_GEOMETRY_LINKED_OUTPUT_TYPE");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x98);
  anon_unknown_1::GeometryShaderInvocationsQueryCase::GeometryShaderInvocationsQueryCase
            ((GeometryShaderInvocationsQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "geometry_shader_invocations","GL_GEOMETRY_SHADER_INVOCATIONS");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pIVar8 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"max_geometry_shader_invocations","",
             0x8e5a,0x20);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
  pTVar4 = local_20;
  pIVar8 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"max_geometry_uniform_blocks","",0x8a2c,
             0xc);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
  pTVar4 = local_20;
  pIVar8 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"max_geometry_shader_storage_blocks","",
             0x90d7,0);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::LayerProvokingVertexQueryCase::LayerProvokingVertexQueryCase
            ((LayerProvokingVertexQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "layer_provoking_vertex","GL_LAYER_PROVOKING_VERTEX");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pPVar9 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar9,(this->super_TestCaseGroup).m_context,"primitives_generated_no_geometry",
             "PRIMITIVES_GENERATED query with no geometry shader",TEST_NO_GEOMETRY);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar9);
  pTVar4 = local_20;
  pPVar9 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar9,(this->super_TestCaseGroup).m_context,"primitives_generated_no_amplification",
             "PRIMITIVES_GENERATED query with non amplifying geometry shader",TEST_NO_AMPLIFICATION)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar9);
  pTVar4 = local_20;
  pPVar9 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar9,(this->super_TestCaseGroup).m_context,"primitives_generated_amplification",
             "PRIMITIVES_GENERATED query with amplifying geometry shader",TEST_AMPLIFICATION);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar9);
  pTVar4 = local_20;
  pPVar9 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar9,(this->super_TestCaseGroup).m_context,"primitives_generated_partial_primitives",
             "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",
             TEST_PARTIAL_PRIMITIVES);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar9);
  pTVar4 = local_20;
  pPVar9 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar9,(this->super_TestCaseGroup).m_context,"primitives_generated_instanced",
             "PRIMITIVES_GENERATED query with instanced geometry shader",TEST_INSTANCED);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar9);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::PrimitivesGeneratedQueryObjectQueryCase::PrimitivesGeneratedQueryObjectQueryCase
            ((PrimitivesGeneratedQueryObjectQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context
             ,"primitives_generated","Query bound PRIMITIVES_GENERATED query");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pIVar8 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"max_framebuffer_layers","",0x9317,0x100);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::FramebufferDefaultLayersCase::FramebufferDefaultLayersCase
            ((FramebufferDefaultLayersCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "framebuffer_default_layers","");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::FramebufferAttachmentLayeredCase::FramebufferAttachmentLayeredCase
            ((FramebufferAttachmentLayeredCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_layered","");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::FramebufferIncompleteLayereTargetsCase::FramebufferIncompleteLayereTargetsCase
            ((FramebufferIncompleteLayereTargetsCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "framebuffer_incomplete_layer_targets","");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ReferencedByGeometryShaderCase::ReferencedByGeometryShaderCase
            ((ReferencedByGeometryShaderCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "referenced_by_geometry_shader","");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = local_20;
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::CombinedGeometryUniformLimitCase::CombinedGeometryUniformLimitCase
            ((CombinedGeometryUniformLimitCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "max_combined_geometry_uniform_components","MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS");
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_1f9 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_10","Output 10 vertices",&local_1f8);
  local_1f9 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_1f8);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_219 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_218,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_128","Output 128 vertices",&local_218);
  local_219 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_218);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_239 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_238,0x100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_256","Output 256 vertices",&local_238);
  local_239 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_238);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_259 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_258,-1);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_max","Output max vertices",&local_258);
  local_259 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_258);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_279 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_278,10,100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_10_and_100","Output 10 and 100 vertices in two invocations",
             &local_278);
  local_279 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_278);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_299 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_298,100,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_100_and_10","Output 100 and 10 vertices in two invocations",
             &local_298);
  local_299 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_298);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  local_2b9 = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_2b8,0,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_0_and_128","Output 0 and 128 vertices in two invocations",
             &local_2b8);
  local_2b9 = 0;
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_2b8);
  pTVar5 = inputPrimitiveGroup;
  pOVar10 = (OutputCountCase *)operator_new(0x140);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_2d8,0x80,0);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar10,pCVar1,"output_128_and_0","Output 128 and 0 vertices in two invocations",
             &local_2d8);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pOVar10);
  anon_unknown_1::OutputCountPatternSpec::~OutputCountPatternSpec(&local_2d8);
  pTVar5 = inputPrimitiveGroup;
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"output_vary_by_attribute",
             "Output varying number of vertices",READ_ATTRIBUTE,MODE_WITHOUT_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  pTVar5 = inputPrimitiveGroup;
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"output_vary_by_uniform",
             "Output varying number of vertices",READ_UNIFORM,MODE_WITHOUT_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  pTVar5 = inputPrimitiveGroup;
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"output_vary_by_texture",
             "Output varying number of vertices",READ_TEXTURE,MODE_WITHOUT_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  pTVar5 = inputPrimitiveGroup;
  pBVar12 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar12,(this->super_TestCaseGroup).m_context,"point_size","test gl_PointSize",
             TEST_POINT_SIZE,0);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pBVar12);
  pTVar5 = inputPrimitiveGroup;
  pBVar12 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar12,(this->super_TestCaseGroup).m_context,"primitive_id_in","test gl_PrimitiveIDIn"
             ,TEST_PRIMITIVE_ID_IN,0);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pBVar12);
  pTVar5 = inputPrimitiveGroup;
  pBVar12 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar12,(this->super_TestCaseGroup).m_context,"primitive_id_in_restarted",
             "test gl_PrimitiveIDIn with primitive restart",TEST_PRIMITIVE_ID_IN,6);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pBVar12);
  pTVar5 = inputPrimitiveGroup;
  pBVar12 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar12,(this->super_TestCaseGroup).m_context,"primitive_id","test gl_PrimitiveID",
             TEST_PRIMITIVE_ID,0);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pBVar12);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_primitive","Different input and output primitives.");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "triangle_strip_adjacency","Different triangle_strip_adjacency vertex counts.");
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 10;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    pGVar13 = (GeometryExpanderRenderTest *)operator_new(0x120);
    lVar14 = (long)(int)name.field_2._12_4_;
    anon_unknown_1::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar13,(this->super_TestCaseGroup).m_context,init::inputPrimitives[lVar14].name,
               init::inputPrimitives[lVar14].name,init::inputPrimitives[lVar14].primitiveType,
               init::inputPrimitives[lVar14].outputType);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pGVar13);
  }
  for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 0xd;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    __return_storage_ptr__ = (string *)((long)&desc.field_2 + 8);
    de::toString<int>(__return_storage_ptr__,(int *)(name.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                   "vertex_count_",__return_storage_ptr__);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    de::toString<int>((string *)&ndx_2,(int *)(name.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   "Vertex count is ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx_2);
    std::__cxx11::string::~string((string *)&ndx_2);
    this_00 = (TriangleStripAdjacencyVertexCountTest *)operator_new(0x128);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar15 = (char *)std::__cxx11::string::c_str();
    pcVar16 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::TriangleStripAdjacencyVertexCountTest::TriangleStripAdjacencyVertexCountTest
              (this_00,pCVar1,pcVar15,pcVar16,name.field_2._8_4_);
    tcu::TestNode::addChild(pTVar7,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)local_318);
  }
  tcu::TestNode::addChild(&conversionPrimitiveGroup->super_TestNode,pTVar4);
  tcu::TestNode::addChild(&conversionPrimitiveGroup->super_TestNode,pTVar7);
  for (name_1.field_2._12_4_ = 0; pTVar5 = emitGroup, (int)name_1.field_2._12_4_ < 6;
      name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
    pGVar13 = (GeometryExpanderRenderTest *)operator_new(0x120);
    lVar14 = (long)(int)name_1.field_2._12_4_;
    anon_unknown_1::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar13,(this->super_TestCaseGroup).m_context,init::conversionPrimitives[lVar14].name
               ,init::conversionPrimitives[lVar14].name,
               init::conversionPrimitives[lVar14].primitiveType,
               init::conversionPrimitives[lVar14].outputType);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pGVar13);
  }
  for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 0x17;
      name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
    pcVar15 = init::emitTests[(int)name_1.field_2._8_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,pcVar15,&local_421);
    std::operator+(&local_400,&local_420,"_emit_");
    de::toString<int>(&local_448,&init::emitTests[(int)name_1.field_2._8_4_].emitCountA);
    std::operator+(&local_3e0,&local_400,&local_448);
    std::operator+(&local_3c0,&local_3e0,"_end_");
    de::toString<int>((string *)((long)&desc_1.field_2 + 8),
                      &init::emitTests[(int)name_1.field_2._8_4_].endCountA);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   &local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    pcVar15 = init::emitTests[(int)name_1.field_2._8_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,pcVar15,&local_529);
    std::operator+(&local_508,&local_528," output, emit ");
    de::toString<int>(&local_550,&init::emitTests[(int)name_1.field_2._8_4_].emitCountA);
    std::operator+(&local_4e8,&local_508,&local_550);
    std::operator+(&local_4c8,&local_4e8," vertices, call EndPrimitive ");
    de::toString<int>(&local_570,&init::emitTests[(int)name_1.field_2._8_4_].endCountA);
    std::operator+(&local_4a8,&local_4c8,&local_570);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                   &local_4a8," times");
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
    if (init::emitTests[(int)name_1.field_2._8_4_].emitCountB != 0) {
      de::toString<int>(&local_5f0,&init::emitTests[(int)name_1.field_2._8_4_].emitCountB);
      std::operator+(&local_5d0,"_emit_",&local_5f0);
      std::operator+(&local_5b0,&local_5d0,"_end_");
      de::toString<int>(&local_610,&init::emitTests[(int)name_1.field_2._8_4_].endCountB);
      std::operator+(&local_590,&local_5b0,&local_610);
      std::__cxx11::string::operator+=((string *)local_3a0,(string *)&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5f0);
      de::toString<int>(&local_6b0,&init::emitTests[(int)name_1.field_2._8_4_].emitCountB);
      std::operator+(&local_690,", emit ",&local_6b0);
      std::operator+(&local_670,&local_690," vertices, call EndPrimitive ");
      de::toString<int>((string *)&testNdx,&init::emitTests[(int)name_1.field_2._8_4_].endCountB);
      std::operator+(&local_650,&local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&testNdx);
      std::operator+(&local_630,&local_650," times");
      std::__cxx11::string::operator+=((string *)local_488,(string *)&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&testNdx);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
    }
    pTVar5 = varyingGroup;
    this_01 = (EmitTest *)operator_new(0x138);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar15 = (char *)std::__cxx11::string::c_str();
    pcVar16 = (char *)std::__cxx11::string::c_str();
    lVar14 = (long)(int)name_1.field_2._8_4_;
    anon_unknown_1::EmitTest::EmitTest
              (this_01,pCVar1,pcVar15,pcVar16,init::emitTests[lVar14].emitCountA,
               init::emitTests[lVar14].endCountA,init::emitTests[lVar14].emitCountB,
               init::emitTests[lVar14].endCountB,init::emitTests[lVar14].outputType);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)local_488);
    std::__cxx11::string::~string((string *)local_3a0);
  }
  for (targetNdx = 0; pTVar5 = layeredGroup, targetNdx < 5; targetNdx = targetNdx + 1) {
    this_02 = (VaryingTest *)operator_new(0x128);
    lVar14 = (long)targetNdx;
    anon_unknown_1::VaryingTest::VaryingTest
              (this_02,(this->super_TestCaseGroup).m_context,init::varyingTests[lVar14].name,
               init::varyingTests[lVar14].desc,init::varyingTests[lVar14].vertexOutputs,
               init::varyingTests[lVar14].geometryOutputs);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)this_02);
  }
  for (local_6d8 = 0; local_6d8 < 6; local_6d8 = local_6d8 + 1) {
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 4;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      pcVar15 = init::tests[local_6d8].testPrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,pcVar15,(allocator<char> *)(desc_2.field_2._M_local_buf + 0xf)
                );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     &local_720,init::layerTargets[(int)name_2.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator((allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
      pcVar15 = init::tests[local_6d8].descPrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&ndx_4,pcVar15,&local_769);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx_4,
                     init::layerTargets[(int)name_2.field_2._12_4_].desc);
      std::__cxx11::string::~string((string *)&ndx_4);
      std::allocator<char>::~allocator(&local_769);
      pTVar5 = instancedGroup;
      pLVar17 = (LayeredRenderCase *)operator_new(0xc0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar15 = (char *)std::__cxx11::string::c_str();
      pcVar16 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                (pLVar17,pCVar1,pcVar15,pcVar16,
                 init::layerTargets[(int)name_2.field_2._12_4_].target,init::tests[local_6d8].test);
      tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pLVar17);
      std::__cxx11::string::~string((string *)local_748);
      std::__cxx11::string::~string((string *)local_700);
    }
  }
  for (local_770 = 0; pTVar5 = negativeGroup, local_770 < 5; local_770 = local_770 + 1) {
    pGVar18 = (GeometryInvocationCase *)operator_new(0x128);
    local_83a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,"geometry_",&local_7d1);
    std::operator+(&local_7b0,&local_7d0,init::invocationCases[local_770].name);
    std::operator+(&local_790,&local_7b0,"_invocations");
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx_5,"Geometry shader with ",&local_839);
    std::operator+(&local_818,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx_5,
                   init::invocationCases[local_770].name);
    std::operator+(&local_7f8,&local_818," invocation(s)");
    pcVar16 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GeometryInvocationCase::GeometryInvocationCase
              (pGVar18,pCVar1,pcVar15,pcVar16,init::invocationCases[local_770].numInvocations,
               CASE_FIXED_OUTPUT_COUNTS);
    local_83a = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pGVar18);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&ndx_5);
    std::allocator<char>::~allocator(&local_839);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator(&local_7d1);
  }
  for (local_840 = 0; pTVar5 = negativeGroup, local_840 < 5; local_840 = local_840 + 1) {
    if (init::invocationCases[local_840].numInvocations != 1) {
      pGVar18 = (GeometryInvocationCase *)operator_new(0x128);
      name_3.field_2._M_local_buf[0xe] = '\x01';
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetNdx_1,"geometry_output_different_",
                 (allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
      std::operator+(&local_880,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &targetNdx_1,init::invocationCases[local_840].name);
      std::operator+(&local_860,&local_880,"_invocations");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::GeometryInvocationCase::GeometryInvocationCase
                (pGVar18,pCVar1,pcVar15,"Geometry shader invocation(s) with different emit counts",
                 init::invocationCases[local_840].numInvocations,CASE_DIFFERENT_OUTPUT_COUNTS);
      name_3.field_2._M_local_buf[0xe] = '\0';
      tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pGVar18);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&targetNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
    }
  }
  for (name_3.field_2._8_4_ = 0; (int)name_3.field_2._8_4_ < 4;
      name_3.field_2._8_4_ = name_3.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e8,"invocation_per_layer_",
               (allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8,
                   &local_8e8,init::layerTargets[(int)name_3.field_2._8_4_].name);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetNdx_2,
               "Render to multiple layers with multiple invocations, one invocation per layer, target "
               ,(allocator<char> *)(name_4.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targetNdx_2
                   ,init::layerTargets[(int)name_3.field_2._8_4_].desc);
    std::__cxx11::string::~string((string *)&targetNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)(name_4.field_2._M_local_buf + 0xf));
    pTVar5 = negativeGroup;
    pLVar17 = (LayeredRenderCase *)operator_new(0xc0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar15 = (char *)std::__cxx11::string::c_str();
    pcVar16 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::LayeredRenderCase::LayeredRenderCase
              (pLVar17,pCVar1,pcVar15,pcVar16,init::layerTargets[(int)name_3.field_2._8_4_].target,
               TEST_INVOCATION_PER_LAYER);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pLVar17);
    std::__cxx11::string::~string((string *)local_910);
    std::__cxx11::string::~string((string *)local_8c8);
  }
  for (name_4.field_2._8_4_ = 0; pTVar5 = negativeGroup, (int)name_4.field_2._8_4_ < 4;
      name_4.field_2._8_4_ = name_4.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_978,"multiple_layers_per_invocation_",
               (allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958,
                   &local_978,init::layerTargets[(int)name_4.field_2._8_4_].name);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&instanceNdx,
               "Render to multiple layers with multiple invocations, multiple layers per invocation, target "
               ,(allocator<char> *)((long)&invocationNdx + 3));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instanceNdx
                   ,init::layerTargets[(int)name_4.field_2._8_4_].desc);
    std::__cxx11::string::~string((string *)&instanceNdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&invocationNdx + 3));
    pTVar5 = negativeGroup;
    pLVar17 = (LayeredRenderCase *)operator_new(0xc0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar15 = (char *)std::__cxx11::string::c_str();
    pcVar16 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::LayeredRenderCase::LayeredRenderCase
              (pLVar17,pCVar1,pcVar15,pcVar16,init::layerTargets[(int)name_4.field_2._8_4_].target,
               TEST_MULTIPLE_LAYERS_PER_INVOCATION);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pLVar17);
    std::__cxx11::string::~string((string *)local_9a0);
    std::__cxx11::string::~string((string *)local_958);
  }
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_attribute",
             "Output varying number of vertices",READ_ATTRIBUTE,MODE_WITH_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  pTVar5 = negativeGroup;
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_uniform",
             "Output varying number of vertices",READ_UNIFORM,MODE_WITH_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  pTVar5 = negativeGroup;
  pVVar11 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar11,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_texture",
             "Output varying number of vertices",READ_TEXTURE,MODE_WITH_INSTANCING);
  tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pVVar11);
  for (local_9c8 = 0; local_9c8 < 3; local_9c8 = local_9c8 + 1) {
    for (name_5.field_2._12_4_ = 0; (int)name_5.field_2._12_4_ < 2;
        name_5.field_2._12_4_ = name_5.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"draw_",&local_a71);
      de::toString<int>(&local_a98,init::numDrawInstances + local_9c8);
      std::operator+(&local_a50,&local_a70,&local_a98);
      std::operator+(&local_a30,&local_a50,"_instances_geometry_");
      de::toString<int>((string *)((long)&desc_5.field_2 + 8),
                        init::numDrawInvocations + (int)name_5.field_2._12_4_);
      std::operator+(&local_a10,&local_a30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&desc_5.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0,
                     &local_a10,"_invocations");
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::~string((string *)(desc_5.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_a50);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_a70);
      std::allocator<char>::~allocator(&local_a71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"Draw ",&local_b59);
      de::toString<int>(&local_b80,init::numDrawInstances + local_9c8);
      std::operator+(&local_b38,&local_b58,&local_b80);
      std::operator+(&local_b18,&local_b38," instances, with ");
      de::toString<int>((string *)&primitiveTypeNdx,
                        init::numDrawInvocations + (int)name_5.field_2._12_4_);
      std::operator+(&local_af8,&local_b18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &primitiveTypeNdx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8,
                     &local_af8," geometry shader invocations.");
      std::__cxx11::string::~string((string *)&local_af8);
      std::__cxx11::string::~string((string *)&primitiveTypeNdx);
      std::__cxx11::string::~string((string *)&local_b18);
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string((string *)&local_b80);
      std::__cxx11::string::~string((string *)&local_b58);
      std::allocator<char>::~allocator(&local_b59);
      pTVar5 = negativeGroup;
      this_03 = (DrawInstancedGeometryInstancedCase *)operator_new(0x128);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar15 = (char *)std::__cxx11::string::c_str();
      pcVar16 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::DrawInstancedGeometryInstancedCase::DrawInstancedGeometryInstancedCase
                (this_03,pCVar1,pcVar15,pcVar16,init::numDrawInstances[local_9c8],
                 init::numDrawInvocations[(int)name_5.field_2._12_4_]);
      tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)this_03);
      std::__cxx11::string::~string((string *)local_ad8);
      std::__cxx11::string::~string((string *)local_9f0);
    }
  }
  for (inputType = 0; pTVar4 = local_78, (int)inputType < 5; inputType = inputType + 1) {
    for (primitiveType = 0; (int)primitiveType < 0xb; primitiveType = primitiveType + 1) {
      name_6.field_2._12_4_ = init::inputTypes[(int)inputType];
      name_6.field_2._8_4_ = init::primitiveTypes[(int)primitiveType];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c30,"type_",&local_c31);
      GVar3 = sglr::rr_util::mapGLGeometryShaderInputType(name_6.field_2._12_4_);
      Functional::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                (&local_c58,(_anonymous_namespace_ *)(ulong)GVar3,inputType_00);
      std::operator+(&local_c10,&local_c30,&local_c58);
      std::operator+(&local_bf0,&local_c10,"_primitive_");
      Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                ((string *)((long)&desc_6.field_2 + 8),
                 (_anonymous_namespace_ *)(ulong)(uint)name_6.field_2._8_4_,primitive);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bd0,
                     &local_bf0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&desc_6.field_2 + 8));
      std::__cxx11::string::~string((string *)(desc_6.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_bf0);
      std::__cxx11::string::~string((string *)&local_c10);
      std::__cxx11::string::~string((string *)&local_c58);
      std::__cxx11::string::~string((string *)&local_c30);
      std::allocator<char>::~allocator(&local_c31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf8,"Shader input type ",&local_cf9);
      GVar3 = sglr::rr_util::mapGLGeometryShaderInputType(name_6.field_2._12_4_);
      Functional::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                (&local_d20,(_anonymous_namespace_ *)(ulong)GVar3,inputType_01);
      std::operator+(&local_cd8,&local_cf8,&local_d20);
      std::operator+(&local_cb8,&local_cd8,", draw primitive type ");
      Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                ((string *)&legalNdx,(_anonymous_namespace_ *)(ulong)(uint)name_6.field_2._8_4_,
                 primitive_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c98,
                     &local_cb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&legalNdx)
      ;
      std::__cxx11::string::~string((string *)&legalNdx);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::__cxx11::string::~string((string *)&local_d20);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::allocator<char>::~allocator(&local_cf9);
      pTVar5 = feedbackGroup;
      bVar2 = false;
      for (local_d48 = 0; local_d48 < 0xb; local_d48 = local_d48 + 1) {
        if ((init::legalConversions[local_d48].inputType == name_6.field_2._12_4_) &&
           (init::legalConversions[local_d48].primitiveType == name_6.field_2._8_4_)) {
          bVar2 = true;
        }
      }
      if (!bVar2) {
        this_04 = (NegativeDrawCase *)operator_new(0x90);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar15 = (char *)std::__cxx11::string::c_str();
        pcVar16 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::NegativeDrawCase::NegativeDrawCase
                  (this_04,pCVar1,pcVar15,pcVar16,name_6.field_2._12_4_,name_6.field_2._8_4_);
        tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)this_04);
      }
      std::__cxx11::string::~string((string *)local_c98);
      std::__cxx11::string::~string((string *)local_bd0);
    }
  }
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_line_loop",
             "Capture line loop lines",METHOD_DRAW_ARRAYS,PRIMITIVE_LINE_LOOP);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_line_strip",
             "Capture line strip lines",METHOD_DRAW_ARRAYS,PRIMITIVE_LINE_STRIP);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_triangle_strip",
             "Capture triangle strip triangles",METHOD_DRAW_ARRAYS,PRIMITIVE_TRIANGLE_STRIP);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_triangle_fan",
             "Capture triangle fan triangles",METHOD_DRAW_ARRAYS,PRIMITIVE_TRIANGLE_FAN);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays",
             "Capture primitives generated with drawArrays",METHOD_DRAW_ARRAYS,PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays_instanced",
             "Capture primitives generated with drawArraysInstanced",METHOD_DRAW_ARRAYS_INSTANCED,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays_indirect",
             "Capture primitives generated with drawArraysIndirect",METHOD_DRAW_ARRAYS_INDIRECT,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements",
             "Capture primitives generated with drawElements",METHOD_DRAW_ELEMENTS,PRIMITIVE_POINTS)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements_instanced",
             "Capture primitives generated with drawElementsInstanced",
             METHOD_DRAW_ELEMENTS_INSTANCED,PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar19 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar19,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements_indirect",
             "Capture primitives generated with drawElementsIndirect",METHOD_DRAW_ELEMENTS_INDIRECT,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar19);
  pTVar4 = local_78;
  pVVar20 = (VertexFeedbackOverflowCase *)operator_new(0x98);
  anon_unknown_1::VertexFeedbackOverflowCase::VertexFeedbackOverflowCase
            (pVVar20,(this->super_TestCaseGroup).m_context,
             "capture_vertex_draw_arrays_overflow_single_buffer",
             "Capture triangles to too small a buffer",METHOD_DRAW_ARRAYS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar20);
  pTVar4 = local_78;
  pVVar20 = (VertexFeedbackOverflowCase *)operator_new(0x98);
  anon_unknown_1::VertexFeedbackOverflowCase::VertexFeedbackOverflowCase
            (pVVar20,(this->super_TestCaseGroup).m_context,
             "capture_vertex_draw_elements_overflow_single_buffer",
             "Capture triangles to too small a buffer",METHOD_DRAW_ELEMENTS);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pVVar20);
  return extraout_EAX;
}

Assistant:

void GeometryShaderTests::init (void)
{
	struct PrimitiveTestSpec
	{
		deUint32	primitiveType;
		const char* name;
		deUint32	outputType;
	};

	struct EmitTestSpec
	{
		deUint32	outputType;
		int			emitCountA;		//!< primitive A emit count
		int			endCountA;		//!< primitive A end count
		int			emitCountB;		//!<
		int			endCountB;		//!<
		const char* name;
	};

	static const struct LayeredTarget
	{
		LayeredRenderCase::LayeredRenderTargetType	target;
		const char*									name;
		const char*									desc;
	} layerTargets[] =
	{
		{ LayeredRenderCase::TARGET_CUBE,			"cubemap",				"cubemap"						},
		{ LayeredRenderCase::TARGET_3D,				"3d",					"3D texture"					},
		{ LayeredRenderCase::TARGET_2D_ARRAY,		"2d_array",				"2D array texture"				},
		{ LayeredRenderCase::TARGET_2D_MS_ARRAY,	"2d_multisample_array",	"2D multisample array texture"	},
	};

	tcu::TestCaseGroup* const queryGroup				= new tcu::TestCaseGroup(m_testCtx, "query", "Query tests.");
	tcu::TestCaseGroup* const basicGroup				= new tcu::TestCaseGroup(m_testCtx, "basic", "Basic tests.");
	tcu::TestCaseGroup* const inputPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "input", "Different input primitives.");
	tcu::TestCaseGroup* const conversionPrimitiveGroup	= new tcu::TestCaseGroup(m_testCtx, "conversion", "Different input and output primitives.");
	tcu::TestCaseGroup* const emitGroup					= new tcu::TestCaseGroup(m_testCtx, "emit", "Different emit counts.");
	tcu::TestCaseGroup* const varyingGroup				= new tcu::TestCaseGroup(m_testCtx, "varying", "Test varyings.");
	tcu::TestCaseGroup* const layeredGroup				= new tcu::TestCaseGroup(m_testCtx, "layered", "Layered rendering.");
	tcu::TestCaseGroup* const instancedGroup			= new tcu::TestCaseGroup(m_testCtx, "instanced", "Instanced rendering.");
	tcu::TestCaseGroup* const negativeGroup				= new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests.");
	tcu::TestCaseGroup* const feedbackGroup				= new tcu::TestCaseGroup(m_testCtx, "vertex_transform_feedback", "Transform feedback.");

	this->addChild(queryGroup);
	this->addChild(basicGroup);
	this->addChild(inputPrimitiveGroup);
	this->addChild(conversionPrimitiveGroup);
	this->addChild(emitGroup);
	this->addChild(varyingGroup);
	this->addChild(layeredGroup);
	this->addChild(instancedGroup);
	this->addChild(negativeGroup);
	this->addChild(feedbackGroup);

	// query test
	{
		// limits with a corresponding glsl constant
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_input_components",				"", GL_MAX_GEOMETRY_INPUT_COMPONENTS,				"MaxGeometryInputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_components",				"", GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				"MaxGeometryOutputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_image_uniforms",					"", GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					"MaxGeometryImageUniforms",			0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_texture_image_units",			"", GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			"MaxGeometryTextureImageUnits",		16));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_vertices",				"", GL_MAX_GEOMETRY_OUTPUT_VERTICES,				"MaxGeometryOutputVertices",		256));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_total_output_components",		"", GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		"MaxGeometryTotalOutputComponents",	1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_uniform_components",				"", GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				"MaxGeometryUniformComponents",		1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counters",				"", GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				"MaxGeometryAtomicCounters",		0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counter_buffers",			"", GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			"MaxGeometryAtomicCounterBuffers",	0));

		// program queries
		queryGroup->addChild(new GeometryShaderVerticesQueryCase	(m_context, "geometry_linked_vertices_out",	"GL_GEOMETRY_LINKED_VERTICES_OUT"));
		queryGroup->addChild(new GeometryShaderInputQueryCase		(m_context, "geometry_linked_input_type",	"GL_GEOMETRY_LINKED_INPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderOutputQueryCase		(m_context, "geometry_linked_output_type",	"GL_GEOMETRY_LINKED_OUTPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderInvocationsQueryCase	(m_context, "geometry_shader_invocations",	"GL_GEOMETRY_SHADER_INVOCATIONS"));

		// limits
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_invocations",		"", GL_MAX_GEOMETRY_SHADER_INVOCATIONS,		32));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_uniform_blocks",			"", GL_MAX_GEOMETRY_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_storage_blocks",	"", GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,	0));

		// layer_provoking_vertex_ext
		queryGroup->addChild(new LayerProvokingVertexQueryCase(m_context, "layer_provoking_vertex", "GL_LAYER_PROVOKING_VERTEX"));

		// primitives_generated
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_geometry",		"PRIMITIVES_GENERATED query with no geometry shader",								PrimitivesGeneratedQueryCase::TEST_NO_GEOMETRY));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_amplification",	"PRIMITIVES_GENERATED query with non amplifying geometry shader",					PrimitivesGeneratedQueryCase::TEST_NO_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_amplification",		"PRIMITIVES_GENERATED query with amplifying geometry shader",						PrimitivesGeneratedQueryCase::TEST_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_partial_primitives", "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",		PrimitivesGeneratedQueryCase::TEST_PARTIAL_PRIMITIVES));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_instanced",			"PRIMITIVES_GENERATED query with instanced geometry shader",						PrimitivesGeneratedQueryCase::TEST_INSTANCED));

		queryGroup->addChild(new PrimitivesGeneratedQueryObjectQueryCase(m_context, "primitives_generated", "Query bound PRIMITIVES_GENERATED query"));

		// fbo
		queryGroup->addChild(new ImplementationLimitCase				(m_context, "max_framebuffer_layers",				"", GL_MAX_FRAMEBUFFER_LAYERS,	256));
		queryGroup->addChild(new FramebufferDefaultLayersCase			(m_context, "framebuffer_default_layers",			""));
		queryGroup->addChild(new FramebufferAttachmentLayeredCase		(m_context, "framebuffer_attachment_layered",		""));
		queryGroup->addChild(new FramebufferIncompleteLayereTargetsCase	(m_context, "framebuffer_incomplete_layer_targets",	""));

		// resource query
		queryGroup->addChild(new ReferencedByGeometryShaderCase			(m_context, "referenced_by_geometry_shader",	""));

		// combined limits
		queryGroup->addChild(new CombinedGeometryUniformLimitCase		(m_context, "max_combined_geometry_uniform_components", "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS"));
	}

	// basic tests
	{
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10",				"Output 10 vertices",								OutputCountPatternSpec(10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128",				"Output 128 vertices",								OutputCountPatternSpec(128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_256",				"Output 256 vertices",								OutputCountPatternSpec(256)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_max",				"Output max vertices",								OutputCountPatternSpec(-1)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10_and_100",		"Output 10 and 100 vertices in two invocations",	OutputCountPatternSpec(10, 100)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_100_and_10",		"Output 100 and 10 vertices in two invocations",	OutputCountPatternSpec(100, 10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_0_and_128",			"Output 0 and 128 vertices in two invocations",		OutputCountPatternSpec(0, 128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128_and_0",			"Output 128 and 0 vertices in two invocations",		OutputCountPatternSpec(128, 0)));

		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_attribute",	"Output varying number of vertices",				VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_uniform",	"Output varying number of vertices",				VaryingOutputCountShader::READ_UNIFORM,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_texture",	"Output varying number of vertices",				VaryingOutputCountShader::READ_TEXTURE,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));

		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"point_size",				"test gl_PointSize",								BuiltinVariableShader::TEST_POINT_SIZE));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in",			"test gl_PrimitiveIDIn",							BuiltinVariableShader::TEST_PRIMITIVE_ID_IN));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in_restarted","test gl_PrimitiveIDIn with primitive restart",		BuiltinVariableShader::TEST_PRIMITIVE_ID_IN, GeometryShaderRenderTest::FLAG_USE_RESTART_INDEX | GeometryShaderRenderTest::FLAG_USE_INDICES));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id",				"test gl_PrimitiveID",								BuiltinVariableShader::TEST_PRIMITIVE_ID));
	}

	// input primitives
	{
		static const PrimitiveTestSpec inputPrimitives[] =
		{
			{ GL_POINTS,					"points",					GL_POINTS			},
			{ GL_LINES,						"lines",					GL_LINE_STRIP		},
			{ GL_LINE_LOOP,					"line_loop",				GL_LINE_STRIP		},
			{ GL_LINE_STRIP,				"line_strip",				GL_LINE_STRIP		},
			{ GL_TRIANGLES,					"triangles",				GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_STRIP,			"triangle_strip",			GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_FAN,				"triangle_fan",				GL_TRIANGLE_STRIP	},
			{ GL_LINES_ADJACENCY,			"lines_adjacency",			GL_LINE_STRIP		},
			{ GL_LINE_STRIP_ADJACENCY,		"line_strip_adjacency",		GL_LINE_STRIP		},
			{ GL_TRIANGLES_ADJACENCY,		"triangles_adjacency",		GL_TRIANGLE_STRIP	}
		};

		tcu::TestCaseGroup* const basicPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "basic_primitive",			"Different input and output primitives.");
		tcu::TestCaseGroup* const triStripAdjacencyGroup	= new tcu::TestCaseGroup(m_testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts.");

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, inputPrimitives[ndx].name, inputPrimitives[ndx].name, inputPrimitives[ndx].primitiveType, inputPrimitives[ndx].outputType));

		// triangle strip adjacency with different vtx counts
		for (int vtxCount = 0; vtxCount <= 12; ++vtxCount)
		{
			const std::string name = "vertex_count_" + de::toString(vtxCount);
			const std::string desc = "Vertex count is " + de::toString(vtxCount);

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(m_context, name.c_str(), desc.c_str(), vtxCount));
		}

		inputPrimitiveGroup->addChild(basicPrimitiveGroup);
		inputPrimitiveGroup->addChild(triStripAdjacencyGroup);
	}

	// different type conversions
	{
		static const PrimitiveTestSpec conversionPrimitives[] =
		{
			{ GL_TRIANGLES,		"triangles_to_points",	GL_POINTS			},
			{ GL_LINES,			"lines_to_points",		GL_POINTS			},
			{ GL_POINTS,		"points_to_lines",		GL_LINE_STRIP		},
			{ GL_TRIANGLES,		"triangles_to_lines",	GL_LINE_STRIP		},
			{ GL_POINTS,		"points_to_triangles",	GL_TRIANGLE_STRIP	},
			{ GL_LINES,			"lines_to_triangles",	GL_TRIANGLE_STRIP	}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
			conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, conversionPrimitives[ndx].name, conversionPrimitives[ndx].name, conversionPrimitives[ndx].primitiveType, conversionPrimitives[ndx].outputType));
	}

	// emit different amounts
	{
		static const EmitTestSpec emitTests[] =
		{
			{ GL_POINTS,			 0,		0,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		2,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		2,	0,	0,	"points"			},
			{ GL_LINE_STRIP,		 0,		0,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	2,	0,	"line_strip"		},
			{ GL_TRIANGLE_STRIP,	 0,		0,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	3,	0,	"triangle_strip"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			std::string name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			std::string desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(m_context, name.c_str(), desc.c_str(), emitTests[ndx].emitCountA, emitTests[ndx].endCountA, emitTests[ndx].emitCountB, emitTests[ndx].endCountB, emitTests[ndx].outputType));
		}
	}

	// varying
	{
		struct VaryingTestSpec
		{
			int			vertexOutputs;
			int			geometryOutputs;
			const char*	name;
			const char*	desc;
		};

		static const VaryingTestSpec varyingTests[] =
		{
			{ -1, 1, "vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{  0, 1, "vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{  0, 2, "vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{  1, 0, "vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{  1, 2, "vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(m_context, varyingTests[ndx].name, varyingTests[ndx].desc, varyingTests[ndx].vertexOutputs, varyingTests[ndx].geometryOutputs));
	}

	// layered
	{
		static const struct TestType
		{
			LayeredRenderCase::TestType	test;
			const char*					testPrefix;
			const char*					descPrefix;
		} tests[] =
		{
			{ LayeredRenderCase::TEST_DEFAULT_LAYER,			"render_with_default_layer_",	"Render to all layers of "					},
			{ LayeredRenderCase::TEST_SINGLE_LAYER,				"render_to_one_",				"Render to one layer of "					},
			{ LayeredRenderCase::TEST_ALL_LAYERS,				"render_to_all_",				"Render to all layers of "					},
			{ LayeredRenderCase::TEST_DIFFERENT_LAYERS,			"render_different_to_",			"Render different data to different layers"	},
			{ LayeredRenderCase::TEST_LAYER_ID,					"fragment_layer_",				"Read gl_Layer in fragment shader"			},
			{ LayeredRenderCase::TEST_LAYER_PROVOKING_VERTEX,	"layer_provoking_vertex_",		"Verify LAYER_PROVOKING_VERTEX"				},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string(tests[testNdx].testPrefix) + layerTargets[targetNdx].name;
			const std::string desc = std::string(tests[testNdx].descPrefix) + layerTargets[targetNdx].desc;

			layeredGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, tests[testNdx].test));
		}
	}

	// instanced
	{
		static const struct InvocationCase
		{
			const char* name;
			int			numInvocations;
		} invocationCases[] =
		{
			{ "1",		1  },
			{ "2",		2  },
			{ "8",		8  },
			{ "32",		32 },
			{ "max",	-1 },
		};
		static const int numDrawInstances[] = { 2, 4, 8 };
		static const int numDrawInvocations[] = { 2, 8 };

		// same amount of content to all invocations
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			instancedGroup->addChild(new GeometryInvocationCase(m_context,
																(std::string("geometry_") + invocationCases[ndx].name + "_invocations").c_str(),
																(std::string("Geometry shader with ") + invocationCases[ndx].name + " invocation(s)").c_str(),
																invocationCases[ndx].numInvocations,
																GeometryInvocationCase::CASE_FIXED_OUTPUT_COUNTS));

		// different amount of content to each invocation
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			if (invocationCases[ndx].numInvocations != 1)
				instancedGroup->addChild(new GeometryInvocationCase(m_context,
																	(std::string("geometry_output_different_") + invocationCases[ndx].name + "_invocations").c_str(),
																	"Geometry shader invocation(s) with different emit counts",
																	invocationCases[ndx].numInvocations,
																	GeometryInvocationCase::CASE_DIFFERENT_OUTPUT_COUNTS));

		// invocation per layer
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("invocation_per_layer_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, one invocation per layer, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_INVOCATION_PER_LAYER));
		}

		// multiple layers per invocation
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("multiple_layers_per_invocation_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, multiple layers per invocation, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_MULTIPLE_LAYERS_PER_INVOCATION));
		}

		// different invocation output counts depending on {uniform, attrib, texture}
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_attribute",	"Output varying number of vertices", VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_uniform",	"Output varying number of vertices", VaryingOutputCountShader::READ_UNIFORM,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_texture",	"Output varying number of vertices", VaryingOutputCountShader::READ_TEXTURE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));

		// with drawInstanced
		for (int instanceNdx = 0; instanceNdx < DE_LENGTH_OF_ARRAY(numDrawInstances); ++instanceNdx)
		for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(numDrawInvocations); ++invocationNdx)
		{
			const std::string name = std::string("draw_") + de::toString(numDrawInstances[instanceNdx]) + "_instances_geometry_" + de::toString(numDrawInvocations[invocationNdx]) + "_invocations";
			const std::string desc = std::string("Draw ") + de::toString(numDrawInstances[instanceNdx]) + " instances, with " + de::toString(numDrawInvocations[invocationNdx]) + " geometry shader invocations.";

			instancedGroup->addChild(new DrawInstancedGeometryInstancedCase(m_context, name.c_str(), desc.c_str(), numDrawInstances[instanceNdx], numDrawInvocations[invocationNdx]));
		}
	}

	// negative (wrong types)
	{
		struct PrimitiveToInputTypeConversion
		{
			GLenum inputType;
			GLenum primitiveType;
		};

		static const PrimitiveToInputTypeConversion legalConversions[] =
		{
			{ GL_POINTS,				GL_POINTS					},
			{ GL_LINES,					GL_LINES					},
			{ GL_LINES,					GL_LINE_LOOP				},
			{ GL_LINES,					GL_LINE_STRIP				},
			{ GL_LINES_ADJACENCY,		GL_LINES_ADJACENCY			},
			{ GL_LINES_ADJACENCY,		GL_LINE_STRIP_ADJACENCY		},
			{ GL_TRIANGLES,				GL_TRIANGLES				},
			{ GL_TRIANGLES,				GL_TRIANGLE_STRIP			},
			{ GL_TRIANGLES,				GL_TRIANGLE_FAN				},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLES_ADJACENCY		},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLE_STRIP_ADJACENCY	},
		};

		static const GLenum inputTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINES_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLES_ADJACENCY
		};

		static const GLenum primitiveTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINE_LOOP,
			GL_LINE_STRIP,
			GL_LINES_ADJACENCY,
			GL_LINE_STRIP_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLE_STRIP,
			GL_TRIANGLE_FAN,
			GL_TRIANGLES_ADJACENCY,
			GL_TRIANGLE_STRIP_ADJACENCY
		};

		for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); ++inputTypeNdx)
		for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
		{
			const GLenum		inputType		= inputTypes[inputTypeNdx];
			const GLenum		primitiveType	= primitiveTypes[primitiveTypeNdx];
			const std::string	name			= std::string("type_") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + "_primitive_" + primitiveTypeToString(primitiveType);
			const std::string	desc			= std::string("Shader input type ") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + ", draw primitive type " + primitiveTypeToString(primitiveType);

			bool isLegal = false;

			for (int legalNdx = 0; legalNdx < DE_LENGTH_OF_ARRAY(legalConversions); ++legalNdx)
				if (legalConversions[legalNdx].inputType == inputType && legalConversions[legalNdx].primitiveType == primitiveType)
					isLegal = true;

			// only illegal
			if (!isLegal)
				negativeGroup->addChild(new NegativeDrawCase(m_context, name.c_str(), desc.c_str(), inputType, primitiveType));
		}
	}

	// vertex transform feedback
	{
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_loop",				"Capture line loop lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_LOOP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_strip",				"Capture line strip lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_strip",			"Capture triangle strip triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_fan",			"Capture triangle fan triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_FAN));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays",				"Capture primitives generated with drawArrays",				VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_instanced",	"Capture primitives generated with drawArraysInstanced",	VertexFeedbackCase::METHOD_DRAW_ARRAYS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_indirect",	"Capture primitives generated with drawArraysIndirect",		VertexFeedbackCase::METHOD_DRAW_ARRAYS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements",			"Capture primitives generated with drawElements",			VertexFeedbackCase::METHOD_DRAW_ELEMENTS,			VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_instanced",	"Capture primitives generated with drawElementsInstanced",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_indirect",	"Capture primitives generated with drawElementsIndirect",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));

		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_arrays_overflow_single_buffer",		"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ARRAYS));
		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_elements_overflow_single_buffer",	"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ELEMENTS));
	}
}